

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_Delay3(int d0,int d1,int d2,int nLutSize)

{
  int iVar1;
  int local_34;
  uint local_2c;
  uint local_28;
  uint local_24;
  int d;
  int n;
  int nLutSize_local;
  int d2_local;
  int d1_local;
  int d0_local;
  
  iVar1 = Abc_MaxInt(d0 >> 4,d1 >> 4);
  iVar1 = Abc_MaxInt(iVar1,d2 >> 4);
  if (iVar1 == d0 >> 4) {
    local_24 = d0 & 0xf;
  }
  else {
    local_24 = 1;
  }
  if (iVar1 == d1 >> 4) {
    local_28 = d1 & 0xf;
  }
  else {
    local_28 = 1;
  }
  if (iVar1 == d2 >> 4) {
    local_2c = d2 & 0xf;
  }
  else {
    local_2c = 1;
  }
  local_34 = local_2c + local_28 + local_24;
  if (nLutSize < local_34) {
    local_34 = 0x13;
  }
  return iVar1 * 0x10 + local_34;
}

Assistant:

static inline int Str_Delay3( int d0, int d1, int d2, int nLutSize )
{
    int n, d = Abc_MaxInt( Abc_MaxInt(d0 >> 4, d1 >> 4), d2 >> 4 );
    n  = (d == (d0 >> 4)) ? (d0 & 15) : 1;
    n += (d == (d1 >> 4)) ? (d1 & 15) : 1;
    n += (d == (d2 >> 4)) ? (d2 & 15) : 1;
    return (d << 4) + (n > nLutSize ? 19 : n);
}